

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferParameters.cpp
# Opt level: O1

GLboolean __thiscall
glcts::TextureBufferParameters::queryTextureBufferOffset
          (TextureBufferParameters *this,GLint expected)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  bool bVar2;
  GLint result;
  int local_1a4;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_1a4 = -1;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xab0))
            ((this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER,0,
             (this->super_TestCaseBase).m_glExtTokens.TEXTURE_BUFFER_OFFSET,&local_1a4);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Could not query value of GL_TEXTURE_BUFFER_OFFSET_EXT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_buffer/esextcTextureBufferParameters.cpp"
                  ,0x15b);
  bVar2 = local_1a4 == expected;
  if (!bVar2) {
    local_1a0._0_8_ = ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"glGetTexLevelParameteriv(GL_TEXTURE_BUFFER_OFFSET_EXT) returned "
               ,0x40);
    std::ostream::operator<<(this_00,local_1a4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," which is not equal to expected offset ",0x27);
    std::ostream::operator<<(this_00,expected);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,".\n",2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
  }
  return bVar2;
}

Assistant:

glw::GLboolean TextureBufferParameters::queryTextureBufferOffset(glw::GLint expected)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint	 result	  = -1;
	glw::GLboolean test_passed = true;

	gl.getTexLevelParameteriv(m_glExtTokens.TEXTURE_BUFFER, 0, m_glExtTokens.TEXTURE_BUFFER_OFFSET, &result);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not query value of GL_TEXTURE_BUFFER_OFFSET_EXT");

	if (result != expected)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message
						   << "glGetTexLevelParameteriv(GL_TEXTURE_BUFFER_OFFSET_EXT) returned " << result
						   << " which is not equal to expected offset " << expected << ".\n"
						   << tcu::TestLog::EndMessage;
	}

	return test_passed;
}